

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLocation __thiscall
slang::SourceManager::createExpansionLoc
          (SourceManager *this,SourceLocation originalLoc,SourceRange expansionRange,bool isMacroArg
          )

{
  SourceRange expansionRange_00;
  uint32_t value;
  SourceLocation originalLoc_00;
  size_type sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SourceLocation in_RDI;
  byte in_R8B;
  basic_string_view<char,_std::char_traits<char>_> name;
  unique_lock<std::shared_mutex> lock;
  ExpansionInfo *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  BufferID buffer;
  BufferID local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  byte local_29;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  SourceLocation local_8;
  
  local_29 = in_R8B & 1;
  local_20 = in_RDX;
  uStack_18 = in_RCX;
  local_10 = in_RSI;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (mutex_type *)in_stack_ffffffffffffff38);
  originalLoc_00 = (SourceLocation)((long)in_RDI + 0x70);
  local_78 = local_10;
  local_88 = local_20;
  uStack_80 = uStack_18;
  expansionRange_00.startLoc._4_4_ = in_stack_ffffffffffffff44;
  expansionRange_00.startLoc._0_4_ = in_stack_ffffffffffffff40;
  expansionRange_00.endLoc = in_RDI;
  ExpansionInfo::ExpansionInfo(in_stack_ffffffffffffff38,originalLoc_00,expansionRange_00,false);
  std::
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  ::emplace_back<slang::SourceManager::ExpansionInfo>
            ((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              *)originalLoc_00,(ExpansionInfo *)in_RDI);
  buffer.id = originalLoc_00._4_4_;
  sVar1 = std::
          vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
          ::size((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                  *)((long)in_RDI + 0x70));
  value = (int)sVar1 - 1;
  name = sv((char *)CONCAT44(value,in_stack_ffffffffffffff40),(size_t)in_stack_ffffffffffffff38);
  BufferID::BufferID(local_98,value,name);
  SourceLocation::SourceLocation
            ((SourceLocation *)in_RDI,buffer,CONCAT44(value,in_stack_ffffffffffffff40));
  std::unique_lock<std::shared_mutex>::~unique_lock
            ((unique_lock<std::shared_mutex> *)CONCAT44(value,in_stack_ffffffffffffff40));
  return local_8;
}

Assistant:

SourceLocation SourceManager::createExpansionLoc(SourceLocation originalLoc,
                                                 SourceRange expansionRange, bool isMacroArg) {
    std::unique_lock<std::shared_mutex> lock(mutex);

    bufferEntries.emplace_back(ExpansionInfo(originalLoc, expansionRange, isMacroArg));
    return SourceLocation(BufferID((uint32_t)(bufferEntries.size() - 1), ""sv), 0);
}